

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundingSphereRecord.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::BoundingSphereRecord::BoundingSphereRecord
          (BoundingSphereRecord *this,KUINT8 Index,WorldCoordinates *CentroidLocation,
          KFLOAT32 Radius)

{
  KFLOAT32 Radius_local;
  WorldCoordinates *CentroidLocation_local;
  KUINT8 Index_local;
  BoundingSphereRecord *this_local;
  
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__BoundingSphereRecord_0033c800;
  WorldCoordinates::WorldCoordinates(&this->m_CentLocation,CentroidLocation);
  this->m_f32Rad = Radius;
  this->m_ui32Padding = 0;
  (this->super_EnvironmentRecord).m_ui8Index = Index;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x10000;
  (this->super_EnvironmentRecord).m_ui16Length = 0x100;
  return;
}

Assistant:

BoundingSphereRecord::BoundingSphereRecord( KUINT8 Index, const WorldCoordinates & CentroidLocation, KFLOAT32 Radius ) :
    m_CentLocation( CentroidLocation ),
    m_f32Rad( Radius ),
    m_ui32Padding( 0 )
{
    m_ui8Index = Index;
    m_ui32EnvRecTyp = BoundingSphereRecordType;
    m_ui16Length = ( BOUNDING_SPHERE_RECORD_SIZE - ENVIRONMENT_RECORD_SIZE ) * 8;
}